

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O2

CommandOptions * read_timed_text_file(CommandOptions *Options,IFileReaderFactory *fileReaderFactory)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  MDD_t MVar6;
  int iVar7;
  long *plVar8;
  undefined8 uVar9;
  char *pcVar10;
  IFileReaderFactory *in_RDX;
  string *this;
  _Self __tmp;
  _List_node_base *p_Var11;
  allocator<char> local_3b2;
  allocator<char> local_3b1;
  MXFReader Reader;
  ui32_t write_count;
  TimedTextDescriptor *tt_descriptor;
  string local_390 [32];
  undefined1 local_370 [17];
  _List_node_base *p_Stack_35f;
  string local_350 [104];
  string XMLDoc;
  FileWriter Writer;
  string out_path;
  undefined1 local_270 [17];
  _List_node_base *p_Stack_25f;
  string local_250 [32];
  FrameBuffer FrameBuffer;
  char buf [64];
  TimedTextDescriptor TDesc;
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  AS_02::TimedText::MXFReader::MXFReader(&Reader,in_RDX);
  ASDCP::TimedText::FrameBuffer::FrameBuffer
            (&FrameBuffer,*(ui32_t *)((long)&fileReaderFactory[4]._vptr_IFileReaderFactory + 4));
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor(&TDesc);
  tt_descriptor = (TimedTextDescriptor *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,(char *)fileReaderFactory[0xb]._vptr_IFileReaderFactory,
             (allocator<char> *)buf);
  AS_02::TimedText::MXFReader::OpenRead((string *)Options);
  std::__cxx11::string::~string(local_350);
  iVar1._0_1_ = Options->error_flag;
  iVar1._1_1_ = Options->key_flag;
  iVar1._2_1_ = Options->read_hmac;
  iVar1._3_1_ = Options->split_wav;
  if (-1 < iVar1) {
    plVar8 = (long *)AS_02::TimedText::MXFReader::OP1aHeader();
    MVar6 = ASDCP::DefaultCompositeDict();
    uVar9 = ASDCP::Dictionary::Type(MVar6);
    (**(code **)(*plVar8 + 0xa8))(local_350,plVar8,uVar9,&tt_descriptor);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
    Kumu::Result_t::~Result_t((Result_t *)local_350);
    if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
      (**(code **)(*(long *)tt_descriptor + 0x88))(tt_descriptor,0);
    }
    iVar2._0_1_ = Options->error_flag;
    iVar2._1_1_ = Options->key_flag;
    iVar2._2_1_ = Options->read_hmac;
    iVar2._3_1_ = Options->split_wav;
    if (-1 < iVar2) {
      XMLDoc._M_dataplus._M_p = (pointer)&XMLDoc.field_2;
      XMLDoc._M_string_length = 0;
      XMLDoc.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                (local_350,(char *)fileReaderFactory[6]._vptr_IFileReaderFactory,
                 (allocator<char> *)buf);
      Kumu::PathDirname((string *)&out_path,(char)local_350);
      std::__cxx11::string::~string(local_350);
      AS_02::TimedText::MXFReader::ReadTimedTextResource
                (local_350,(AESDecContext *)&Reader,(HMACContext *)&XMLDoc);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
      Kumu::Result_t::~Result_t((Result_t *)local_350);
      iVar7._0_1_ = Options->error_flag;
      iVar7._1_1_ = Options->key_flag;
      iVar7._2_1_ = Options->read_hmac;
      iVar7._3_1_ = Options->split_wav;
      if (-1 < iVar7) {
        AS_02::TimedText::MXFReader::FillTimedTextDescriptor((TimedTextDescriptor *)local_98);
        Kumu::Result_t::~Result_t(local_98);
        ASDCP::FrameBuffer::Capacity((uint)local_100);
        Kumu::Result_t::~Result_t(local_100);
        if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
          ASDCP::TimedText::DescriptorDump(&TDesc,(_IO_FILE *)0x0);
        }
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->read_hmac;
        iVar7._3_1_ = Options->split_wav;
        if ((-1 < iVar7) &&
           (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
          Kumu::FileWriter::FileWriter(&Writer);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_390,(char *)fileReaderFactory[6]._vptr_IFileReaderFactory,
                     (allocator<char> *)local_370);
          Kumu::FileWriter::OpenWrite(local_350);
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
          Kumu::Result_t::~Result_t((Result_t *)local_350);
          std::__cxx11::string::~string(local_390);
          iVar3._0_1_ = Options->error_flag;
          iVar3._1_1_ = Options->key_flag;
          iVar3._2_1_ = Options->read_hmac;
          iVar3._3_1_ = Options->split_wav;
          if (-1 < iVar3) {
            Kumu::FileWriter::Write
                      ((uchar *)local_350,(uint)&Writer,(uint *)XMLDoc._M_dataplus._M_p);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
            Kumu::Result_t::~Result_t((Result_t *)local_350);
          }
          Kumu::FileWriter::~FileWriter(&Writer);
          iVar7._0_1_ = Options->error_flag;
          iVar7._1_1_ = Options->key_flag;
          iVar7._2_1_ = Options->read_hmac;
          iVar7._3_1_ = Options->split_wav;
        }
      }
      p_Var11 = TDesc.ResourceList.
                super__List_base<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      while ((p_Var11 != (_List_node_base *)&TDesc.ResourceList && (-1 < iVar7))) {
        _Writer = &PTR__IArchive_00111bf0;
        AS_02::TimedText::MXFReader::ReadAncillaryResource
                  ((UUID *)local_350,(FrameBuffer *)&Reader,(AESDecContext *)&Writer,
                   (HMACContext *)&FrameBuffer);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
        Kumu::Result_t::~Result_t((Result_t *)local_350);
        iVar7._0_1_ = Options->error_flag;
        iVar7._1_1_ = Options->key_flag;
        iVar7._2_1_ = Options->read_hmac;
        iVar7._3_1_ = Options->split_wav;
        if ((-1 < iVar7) &&
           (*(char *)((long)&fileReaderFactory[1]._vptr_IFileReaderFactory + 4) == '\0')) {
          Kumu::FileWriter::FileWriter(&Writer);
          bVar5 = std::operator!=(&out_path,"");
          if (bVar5) {
            local_270[8] = true;
            local_270._9_8_ = p_Var11[1]._M_next;
            p_Stack_25f = p_Var11[1]._M_prev;
            local_270._0_8_ = &PTR__IArchive_00111bf0;
            pcVar10 = Kumu::UUID::EncodeHex((UUID *)local_270,buf,0x40);
            std::__cxx11::string::string<std::allocator<char>>(local_250,pcVar10,&local_3b1);
            Kumu::PathJoin((string *)local_370,(string *)&out_path,(char)local_250);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_390,(char *)local_370._0_8_,&local_3b2);
            Kumu::FileWriter::OpenWrite(local_350);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
            Kumu::Result_t::~Result_t((Result_t *)local_350);
            std::__cxx11::string::~string(local_390);
            std::__cxx11::string::~string((string *)local_370);
            this = local_250;
          }
          else {
            local_370[8] = '\x01';
            local_370._9_8_ = p_Var11[1]._M_next;
            p_Stack_35f = p_Var11[1]._M_prev;
            local_370._0_8_ = &PTR__IArchive_00111bf0;
            pcVar10 = Kumu::UUID::EncodeHex((UUID *)local_370,buf,0x40);
            std::__cxx11::string::string<std::allocator<char>>
                      (local_390,pcVar10,(allocator<char> *)local_250);
            Kumu::FileWriter::OpenWrite(local_350);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
            Kumu::Result_t::~Result_t((Result_t *)local_350);
            this = local_390;
          }
          std::__cxx11::string::~string(this);
          iVar4._0_1_ = Options->error_flag;
          iVar4._1_1_ = Options->key_flag;
          iVar4._2_1_ = Options->read_hmac;
          iVar4._3_1_ = Options->split_wav;
          if (-1 < iVar4) {
            Kumu::FileWriter::Write((uchar *)local_350,(uint)&Writer,(uint *)FrameBuffer._8_8_);
            Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_350);
            Kumu::Result_t::~Result_t((Result_t *)local_350);
          }
          if (*(char *)((long)&fileReaderFactory->_vptr_IFileReaderFactory + 5) == '\x01') {
            ASDCP::TimedText::FrameBuffer::Dump((_IO_FILE *)&FrameBuffer,(uint)_stderr);
          }
          Kumu::FileWriter::~FileWriter(&Writer);
          iVar7._0_1_ = Options->error_flag;
          iVar7._1_1_ = Options->key_flag;
          iVar7._2_1_ = Options->read_hmac;
          iVar7._3_1_ = Options->split_wav;
        }
        p_Var11 = p_Var11->_M_next;
      }
      std::__cxx11::string::~string((string *)&out_path);
      std::__cxx11::string::~string((string *)&XMLDoc);
    }
  }
  ASDCP::TimedText::TimedTextDescriptor::~TimedTextDescriptor(&TDesc);
  ASDCP::TimedText::FrameBuffer::~FrameBuffer(&FrameBuffer);
  AS_02::TimedText::MXFReader::~MXFReader(&Reader);
  return Options;
}

Assistant:

Result_t
read_timed_text_file(CommandOptions& Options, const Kumu::IFileReaderFactory& fileReaderFactory)
{
  AESDecContext*     Context = 0;
  HMACContext*       HMAC = 0;
  AS_02::TimedText::MXFReader     Reader(fileReaderFactory);
  TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  //ASDCP::TimedText::FrameBuffer   FrameBuffer(Options.fb_size);
  AS_02::TimedText::TimedTextDescriptor TDesc;
  ASDCP::MXF::TimedTextDescriptor *tt_descriptor = 0;

  Result_t result = Reader.OpenRead(Options.input_filename);

  if ( ASDCP_SUCCESS(result) )
    {
      result = Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_TimedTextDescriptor),
						     reinterpret_cast<MXF::InterchangeObject**>(&tt_descriptor));
    if ( Options.verbose_flag ) {
    	tt_descriptor->Dump();
    }


  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  std::string out_path = Kumu::PathDirname(Options.file_prefix);
  ui32_t write_count;
  char buf[64];
  TimedText::ResourceList_t::const_iterator ri;

  result = Reader.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    {
      Reader.FillTimedTextDescriptor(TDesc);
      FrameBuffer.Capacity(Options.fb_size);

      if ( Options.verbose_flag )
	TimedText::DescriptorDump(TDesc);
    }

  if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
    {
      Kumu::FileWriter Writer;
      result = Writer.OpenWrite(Options.file_prefix);

      if ( ASDCP_SUCCESS(result) )
	result = Writer.Write(reinterpret_cast<const byte_t*>(XMLDoc.c_str()), XMLDoc.size(), &write_count);
    }

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Reader.ReadAncillaryResource(ri->ResourceID, FrameBuffer, Context, HMAC);

      if ( ASDCP_SUCCESS(result) && ( ! Options.no_write_flag ) )
	{
	  Kumu::FileWriter Writer;
	  if (out_path != "") {
		  result = Writer.OpenWrite(Kumu::PathJoin(out_path, Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64)).c_str());
	  } else {
		  // Workaround for a bug in Kumu::PathJoin
		  result = Writer.OpenWrite(Kumu::UUID(ri->ResourceID).EncodeHex(buf, 64));
	  }

	  if ( ASDCP_SUCCESS(result) )
	    result = Writer.Write(FrameBuffer.RoData(), FrameBuffer.Size(), &write_count);

	      if ( Options.verbose_flag )
		FrameBuffer.Dump(stderr, Options.fb_dump_size);
	}
    }
    }
  return result;
}